

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::throwExceptionWithDetail
          (TestMoreStuffImpl *this,ThrowExceptionWithDetailContext context)

{
  char (*in_RCX) [15];
  ArrayPtr<const_unsigned_char> in_stack_fffffffffffffe40;
  Exception e;
  
  kj::_::Debug::makeDescription<char_const(&)[15]>
            ((String *)&stack0xfffffffffffffe48,(Debug *)"\"test exception\"","test exception",
             in_RCX);
  kj::Exception::Exception
            (&e,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x4c4,(String *)&stack0xfffffffffffffe48);
  kj::Array<char>::~Array((Array<char> *)&stack0xfffffffffffffe48);
  kj::heapArray<unsigned_char>(in_stack_fffffffffffffe40);
  kj::Exception::setDetail(&e,1,(Array<unsigned_char> *)&stack0xfffffffffffffe30);
  kj::Array<unsigned_char>::~Array((Array<unsigned_char> *)&stack0xfffffffffffffe30);
  kj::Promise<void>::Promise((Promise<void> *)this,&e);
  kj::Exception::~Exception(&e);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::throwExceptionWithDetail(
    ThrowExceptionWithDetailContext context) {
  auto e = KJ_EXCEPTION(FAILED, "test exception");
  e.setDetail(1, kj::heapArray<byte>("foo"_kjb));
  return e;
}